

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_night_time(tgestate_t *state)

{
  route_t *in_RDI;
  
  if (in_RDI[0x37b].index == '\0') {
    set_hero_route(state,in_RDI);
  }
  set_day_or_night(state,(uint8_t)((ulong)in_RDI >> 0x38));
  return;
}

Assistant:

static void event_night_time(tgestate_t *state)
{
  assert(state != NULL);

  if (state->hero_in_bed == 0)
  {
    static const route_t t = { routeindex_44_HUT2_RIGHT_TO_LEFT, 1 }; /* was BC */
    set_hero_route(state, &t);
  }
  set_day_or_night(state, 255);
}